

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

char * read_file(char *path)

{
  FILE *__stream;
  size_t __n;
  char *__ptr;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    __ptr = (char *)0x0;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    __ptr = (char *)malloc(__n + 1);
    fread(__ptr,1,__n,__stream);
    fclose(__stream);
    __ptr[__n] = '\0';
  }
  return __ptr;
}

Assistant:

char * read_file(char *path) {
	FILE *f = fopen(path, "r");
	if (f == NULL) {
		return NULL;
	}

	// Get the length of the file
	// TODO: proper error handling; so many of these functions set errno
	fseek(f, 0, SEEK_END);
	size_t length = (size_t) ftell(f);
	rewind(f);

	// Read its contents
	char *contents = malloc(length + 1);
	fread(contents, sizeof(char), length, f);
	fclose(f);
	contents[length] = '\0';
	return contents;
}